

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rifiuti-vista.c
# Opt level: O1

int main(int argc,char **argv)

{
  GPtrArray *pGVar1;
  bool bVar2;
  metarecord *pmVar3;
  _Bool _Var4;
  GQuark GVar5;
  uint uVar6;
  exitcode eVar7;
  int iVar8;
  undefined8 uVar9;
  GError *pGVar10;
  ulong uVar11;
  ulong *puVar12;
  GDateTime *pGVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 *puVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  code *pcVar20;
  char *pcVar21;
  GError **ppGVar22;
  ulong *puVar23;
  uint uVar24;
  GError *error;
  long lStack_90;
  uint uStack_84;
  ulong *puStack_80;
  ulong uStack_78;
  long lStack_70;
  code *pcStack_68;
  ulong uStack_60;
  ulong *puStack_58;
  char *pcStack_50;
  ulong uStack_48;
  GError *local_18;
  char **local_10;
  
  ppGVar22 = &local_18;
  local_18 = (GError *)0x0;
  local_10 = argv;
  _Var4 = rifiuti_init(RECYCLE_BIN_TYPE_DIR,"DIR_OR_FILE",
                       "Parse index files in C:\\$Recycle.bin style folder and dump recycle bin data.  Can also dump a single index file."
                       ,&local_10,&local_18);
  if (!_Var4) goto LAB_00103cb7;
  do_parse_records(_parse_record_cb);
  if ((meta->records->len == 0) && (iVar8 = g_hash_table_size(meta->invalid_records), iVar8 != 0)) {
    GVar5 = rifiuti_fatal_error_quark();
    pcVar21 = "No valid recycle bin record found";
LAB_00103c41:
    uVar9 = dcgettext(0,pcVar21,5);
    g_set_error_literal(&local_18,GVar5,1,uVar9);
LAB_00103cb7:
    eVar7 = rifiuti_cleanup(&local_18);
    return eVar7;
  }
  pcVar20 = _sort_record_by_time;
  g_ptr_array_sort(meta->records);
  pmVar3 = meta;
  pGVar1 = meta->records;
  if (pGVar1->len == 0) {
    meta->version = -1;
  }
  else {
    meta->version = **pGVar1->pdata;
    pcVar20 = _compare_idx_versions;
    g_ptr_array_foreach(pGVar1,_compare_idx_versions,pmVar3);
    if (pmVar3->version == -2) {
      GVar5 = rifiuti_fatal_error_quark();
      pcVar21 = 
      "Index files from multiple Windows versions are mixed together.  Please check each file individually."
      ;
      goto LAB_00103c41;
    }
  }
  _Var4 = dump_content(&local_18);
  if (_Var4) goto LAB_00103cb7;
  uVar24 = local_18->domain;
  uVar6 = g_file_error_quark();
  if (uVar24 == uVar6) {
    GVar5 = rifiuti_fatal_error_quark();
    uVar9 = g_strdup(local_18->message);
    pGVar10 = (GError *)g_error_new_literal(GVar5,2,uVar9);
    g_error_free(local_18);
    local_18 = pGVar10;
    goto LAB_00103cb7;
  }
  main_cold_1();
  lStack_90 = 0;
  uStack_48 = (ulong)uVar24;
  uVar11 = g_path_get_basename();
  puStack_80 = (ulong *)0x0;
  if ((ppGVar22 == (GError **)0x0) || (*(char *)ppGVar22 == '\0')) {
    pcVar21 = "filename && *filename";
LAB_00103d36:
    g_return_if_fail_warning("rifiuti2","_validate_index_file",pcVar21);
    uVar19 = 0;
LAB_00103d3d:
    puVar23 = (ulong *)0x0;
    bVar2 = false;
  }
  else {
    if (lStack_90 != 0) {
      pcVar21 = "! error || ! *error";
      goto LAB_00103d36;
    }
    uVar19 = 0;
    g_log("rifiuti2",0x80,"Start file validation for \'%s\'...",ppGVar22);
    iVar8 = g_file_get_contents(ppGVar22,&puStack_80,&uStack_78,&lStack_90);
    if (iVar8 == 0) {
LAB_001041ff:
      g_free(puStack_80);
      goto LAB_00103d3d;
    }
    if (uStack_78 < 0x19) {
      GVar5 = rifiuti_record_error_quark();
      uVar19 = 0;
LAB_00104008:
      uVar9 = dcgettext(0,"File is not a $Recycle.bin index",5);
      g_set_error_literal(&lStack_90,GVar5,4,uVar9);
      goto LAB_001041ff;
    }
    uVar19 = *puStack_80;
    g_log("rifiuti2",0x80,"version = %lu",uVar19);
    puVar23 = puStack_80;
    if (uVar19 != 1) {
      if (uVar19 != 2) {
        GVar5 = rifiuti_record_error_quark();
        if (uVar19 < 10) {
          pcVar21 = (char *)dcgettext(0,"Index file version %lu is unsupported",5);
          uVar18 = uVar19;
        }
        else {
          uVar18 = dcgettext(0,"File is not a $Recycle.bin index",5);
          pcVar21 = "%s";
        }
        g_set_error(&lStack_90,GVar5,5,pcVar21,uVar18);
        goto LAB_001041ff;
      }
      if (uStack_78 < 0x1d) {
        GVar5 = rifiuti_record_error_quark();
        goto LAB_00104008;
      }
    }
    g_log("rifiuti2",0x80,"Finished file validation for \'%s\'",ppGVar22);
    bVar2 = true;
  }
  if (!bVar2) {
    uVar9 = *(undefined8 *)(pcVar20 + 0x30);
    uVar15 = g_strdup(uVar11);
    g_hash_table_replace(uVar9,uVar15,lStack_90);
    iVar8 = g_free(uVar11);
    return iVar8;
  }
  g_log("rifiuti2",0x80,"Start populating record for \'%s\'...",uVar11);
  pcStack_68 = pcVar20;
  uStack_60 = uVar11;
  pcStack_50 = (char *)ppGVar22;
  if (uVar19 == 2) {
    uVar24 = (int)puVar23[3] * 2;
    uStack_84 = (int)uStack_78 - 0x1c;
    lStack_70 = (long)puVar23 + 0x1c;
    uVar11 = 0;
  }
  else {
    if (uVar19 != 1) {
      g_assertion_message_expr
                ("rifiuti2",
                 "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/rifiuti-vista.c"
                 ,0x8b,"_populate_record_data",0);
    }
    uStack_84 = (int)uStack_78 - 0x18;
    uVar24 = 0x208;
    if (uStack_78 == 0x21f) {
      uStack_84 = 0x208;
    }
    uVar11 = (ulong)(uStack_78 == 0x21f);
    lStack_70 = (long)puVar23 + (0x18 - uVar11);
  }
  puVar12 = (ulong *)g_malloc0(0x50);
  *puVar12 = uVar19;
  puStack_58 = puVar23;
  memcpy(puVar12 + 5,puVar23 + 1,8 - uVar11);
  if ((char)uVar11 == '\0') {
    g_log("rifiuti2",0x80,"deleted file size = %lu",puVar12[5]);
  }
  else {
    g_log("rifiuti2",0x80,"filesize field broken, 56 bit only, val=0x%lX",puVar12[5]);
    puVar12[5] = 0xffffffffffffffff;
  }
  uVar19 = *(ulong *)((long)puStack_58 + (0x10 - uVar11));
  puVar12[4] = uVar19;
  pGVar13 = win_filetime_to_gdatetime(uVar19);
  puVar12[3] = (ulong)pGVar13;
  puVar23 = puVar12 + 9;
  if (puVar12[9] == 0) {
    uVar9 = g_date_time_new_now_utc();
    lVar14 = g_date_time_difference(puVar12[3],uVar9);
    if ((0x1f540500 < lVar14) || (iVar8 = g_date_time_get_year(puVar12[3]), iVar8 < 0x7d7)) {
      GVar5 = rifiuti_record_error_quark();
      uVar15 = dcgettext(0,"File deletion time is suspicious or broken",5);
      g_set_error_literal(puVar23,GVar5,1,uVar15);
    }
    g_date_time_unref(uVar9);
  }
  if (uVar24 < uStack_84) {
    pcVar21 = "Ignored dangling extraneous data after record";
  }
  else {
    if ((char)uVar11 != '\0' || uVar24 <= uStack_84) goto LAB_00103f3b;
    pcVar21 = "Record is truncated, thus unicode path might be incomplete";
  }
  GVar5 = rifiuti_record_error_quark();
  uVar9 = dcgettext(0,pcVar21,5);
  g_set_error_literal(puVar23,GVar5,2,uVar9);
LAB_00103f3b:
  if (uStack_84 < uVar24) {
    uVar24 = uStack_84;
  }
  puVar16 = (undefined8 *)g_string_new_len(lStack_70,uVar24);
  puVar12[6] = (ulong)puVar16;
  sVar17 = ucs2_bytelen((char *)*puVar16,puVar16[1]);
  if (puVar12[9] == 0) {
    lVar14 = g_convert(*puVar16,sVar17,"UTF-8","UTF-16LE",0,0,0);
    if (lVar14 == 0) {
      GVar5 = rifiuti_record_error_quark();
      uVar9 = dcgettext(0,"Path contains broken unicode character(s)",5);
      g_set_error_literal(puVar23,GVar5,3,uVar9);
    }
    else {
      g_free(lVar14);
    }
  }
  g_free(puStack_58);
  if (isolated_index == true) {
    *(undefined4 *)(puVar12 + 8) = 0;
    uVar11 = uStack_60;
  }
  else {
    uVar9 = g_path_get_dirname(pcStack_50);
    uVar11 = uStack_60;
    lVar14 = g_strdup(uStack_60);
    *(undefined1 *)(lVar14 + 1) = 0x52;
    uVar15 = g_build_filename(uVar9,lVar14,0);
    iVar8 = g_file_test(uVar15,0x10);
    *(uint *)(puVar12 + 8) = (iVar8 == 0) + 1;
    g_free(uVar9);
    g_free(lVar14);
    g_free(uVar15);
  }
  puVar12[2] = uVar11;
  g_ptr_array_add(*(undefined8 *)(pcStack_68 + 0x28),puVar12);
  iVar8 = g_log("rifiuti2",0x80,"Parsing done for \'%s\'",uVar11);
  return iVar8;
}

Assistant:

int
main (int    argc,
      char **argv)
{
    GError *error = NULL;

    UNUSED (argc);

    if (! rifiuti_init (
        RECYCLE_BIN_TYPE_DIR,
        N_("DIR_OR_FILE"),
        N_("Parse index files in C:\\$Recycle.bin style "
           "folder and dump recycle bin data.  "
           "Can also dump a single index file."),
        &argv, &error
    ))
        goto cleanup;

    do_parse_records (&_parse_record_cb);

    if (! meta->records->len && g_hash_table_size (meta->invalid_records))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("No valid recycle bin record found"));
        goto cleanup;
    }

    g_ptr_array_sort (meta->records, _sort_record_by_time);
    if (! _set_overall_rbin_version (meta))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("Index files from multiple Windows versions are mixed together."
            "  Please check each file individually."));
        goto cleanup;
    }

    if (! dump_content (&error))
    {
        g_assert (error->domain == G_FILE_ERROR);
        GError *new_err = g_error_new_literal (
            R2_FATAL_ERROR, R2_FATAL_ERROR_TEMPFILE,
            g_strdup (error->message));
        g_error_free (error);
        error = new_err;
    }

    cleanup:

    return rifiuti_cleanup (&error);
}